

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<613U,_Fixpp::Type::Char>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  undefined4 in_register_0000003c;
  undefined8 uStack_28;
  
  uVar1 = *__buf;
  uStack_28 = in_RAX;
  poVar2 = std::ostream::_M_insert<unsigned_long>(CONCAT44(in_register_0000003c,__fd));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
  uStack_28 = CONCAT17(uVar1,(undefined7)uStack_28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)((long)&uStack_28 + 7),1);
  uStack_28._0_7_ = CONCAT16(0x7c,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_28 + 6),1);
  return CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }